

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  Entry *pEVar4;
  
  pEVar4 = this->pos;
  if (this->start < pEVar4) {
    do {
      this->pos = (Entry *)&pEVar4[-2].key.super_StringPtr.content.size_;
      lVar1 = *(long *)&pEVar4[-2].value;
      if (lVar1 != 0) {
        pcVar2 = pEVar4[-1].key.super_StringPtr.content.ptr;
        sVar3 = pEVar4[-1].key.super_StringPtr.content.size_;
        *(undefined8 *)&pEVar4[-2].value = 0;
        pEVar4[-1].key.super_StringPtr.content.ptr = (char *)0x0;
        pEVar4[-1].key.super_StringPtr.content.size_ = 0;
        (**(code **)**(undefined8 **)&pEVar4[-1].value)
                  (*(undefined8 **)&pEVar4[-1].value,lVar1,8,(long)pcVar2 - lVar1 >> 3,
                   (long)(sVar3 - lVar1) >> 3,0);
      }
      pEVar4 = this->pos;
    } while (this->start < pEVar4);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }